

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

void secp256k1_compute_prehash
               (secp256k1_context *ctx,uchar *output,secp256k1_pubkey *pubkeys,size_t n_pubkeys,
               secp256k1_fe *nonce_ge_x,uchar *msghash32)

{
  int iVar1;
  ulong in_RCX;
  secp256k1_fe *in_R8;
  secp256k1_sha256 hasher;
  size_t buflen;
  uchar buf [33];
  size_t i;
  size_t in_stack_ffffffffffffff30;
  uchar *in_stack_ffffffffffffff38;
  secp256k1_sha256 *in_stack_ffffffffffffff40;
  uchar *in_stack_ffffffffffffff58;
  secp256k1_sha256 *in_stack_ffffffffffffff60;
  uint in_stack_ffffffffffffff8c;
  secp256k1_pubkey *pubkey;
  size_t *in_stack_ffffffffffffff98;
  uchar *in_stack_ffffffffffffffa0;
  secp256k1_context *in_stack_ffffffffffffffa8;
  ulong local_38;
  
  pubkey = (secp256k1_pubkey *)0x21;
  secp256k1_sha256_initialize((secp256k1_sha256 *)&stack0xffffffffffffff28);
  secp256k1_fe_get_b32(&stack0xffffffffffffff98,in_R8);
  secp256k1_sha256_write
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  local_38 = 0;
  while( true ) {
    if (in_RCX <= local_38) {
      secp256k1_sha256_write
                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
      secp256k1_sha256_finalize(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      return;
    }
    iVar1 = secp256k1_ec_pubkey_serialize
                      (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98
                       ,pubkey,in_stack_ffffffffffffff8c);
    if (iVar1 == 0) break;
    secp256k1_sha256_write
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    local_38 = local_38 + 1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/tangramproject[P]secp256k1-zkp/src/modules/aggsig/main_impl.h"
          ,0x4f,
          "test condition failed: secp256k1_ec_pubkey_serialize(ctx, buf, &buflen, &pubkeys[i], SECP256K1_EC_COMPRESSED)"
         );
  abort();
}

Assistant:

static void secp256k1_compute_prehash(const secp256k1_context *ctx, unsigned char *output, const secp256k1_pubkey *pubkeys, size_t n_pubkeys, const secp256k1_fe *nonce_ge_x, const unsigned char *msghash32) {
    size_t i;
    unsigned char buf[33];
    size_t buflen = sizeof(buf);
    secp256k1_sha256 hasher;
    secp256k1_sha256_initialize(&hasher);

    /* Encode nonce */
    secp256k1_fe_get_b32(buf, nonce_ge_x);
    secp256k1_sha256_write(&hasher, buf, 32);

    /* Encode pubkeys */
    for (i = 0; i < n_pubkeys; i++) {
        CHECK(secp256k1_ec_pubkey_serialize(ctx, buf, &buflen, &pubkeys[i], SECP256K1_EC_COMPRESSED));
        secp256k1_sha256_write(&hasher, buf, sizeof(buf));
    }

    /* Encode message */
    secp256k1_sha256_write(&hasher, msghash32, 32);

    /* Finish */
    secp256k1_sha256_finalize(&hasher, output);
}